

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O1

void BrotliSplitBlockLiteralsFromStored
               (MemoryManager *m,Command *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *literal_split,BlockSplitFromDecoder *literal_split_decoder,
               size_t *cur_block_decoder)

{
  size_t __size;
  uint uVar1;
  uint8_t *__dest;
  uint32_t *__dest_00;
  void *__s;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  
  uVar7 = literal_split->types_alloc_size;
  uVar8 = literal_split_decoder->num_blocks;
  if (uVar7 < uVar8) {
    if (uVar7 == 0) {
      uVar7 = uVar8;
    }
    do {
      uVar3 = uVar7;
      uVar7 = uVar3 * 2;
    } while (uVar3 < uVar8);
    if (uVar3 == 0) {
      __dest = (uint8_t *)0x0;
    }
    else {
      __dest = (uint8_t *)BrotliAllocate(m,uVar3);
    }
    if (literal_split->types_alloc_size != 0) {
      memcpy(__dest,literal_split->types,literal_split->types_alloc_size);
    }
    BrotliFree(m,literal_split->types);
    literal_split->types = __dest;
    literal_split->types_alloc_size = uVar3;
  }
  uVar7 = literal_split->lengths_alloc_size;
  uVar8 = literal_split_decoder->num_blocks;
  if (uVar7 < uVar8) {
    if (uVar7 == 0) {
      uVar7 = uVar8;
    }
    do {
      uVar3 = uVar7;
      uVar7 = uVar3 * 2;
    } while (uVar3 < uVar8);
    if (uVar3 == 0) {
      __dest_00 = (uint32_t *)0x0;
    }
    else {
      __dest_00 = (uint32_t *)BrotliAllocate(m,uVar3 * 4);
    }
    if (literal_split->lengths_alloc_size != 0) {
      memcpy(__dest_00,literal_split->lengths,literal_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,literal_split->lengths);
    literal_split->lengths = __dest_00;
    literal_split->lengths_alloc_size = uVar3;
  }
  literal_split->num_types = 0;
  literal_split->num_blocks = 0;
  sVar10 = literal_split_decoder->num_types;
  __size = sVar10 * 4;
  __s = malloc(__size);
  if (sVar10 != 0) {
    memset(__s,0xff,__size);
  }
  iVar2 = 0;
  if (num_commands == 0) {
    lVar6 = 0;
  }
  else {
    uVar7 = 0;
    lVar6 = 0;
    do {
      if (literal_split_decoder->positions_end[*cur_block_decoder] <= pos) {
        if (lVar6 != 0) {
          uVar8 = (ulong)literal_split_decoder->types[*cur_block_decoder];
          if (*(int *)((long)__s + uVar8 * 4) == -1) {
            *(int *)((long)__s + uVar8 * 4) = (int)literal_split->num_types;
          }
          sVar10 = literal_split->num_blocks;
          if ((sVar10 == 0) ||
             (*(uint *)((long)__s + uVar8 * 4) != (uint)literal_split->types[sVar10 - 1])) {
            literal_split->types[sVar10] = *(uint8_t *)((long)__s + uVar8 * 4);
            sVar10 = literal_split->num_blocks;
            literal_split->lengths[sVar10] = (uint32_t)lVar6;
            uVar1 = (uint)literal_split->num_types;
            bVar4 = literal_split->types[sVar10] + 1;
            uVar9 = (uint)bVar4;
            if (bVar4 < (byte)uVar1) {
              uVar9 = uVar1;
            }
            literal_split->num_types = (ulong)(uVar9 & 0xff);
            literal_split->num_blocks = sVar10 + 1;
          }
          else {
            literal_split->lengths[sVar10 - 1] =
                 literal_split->lengths[sVar10 - 1] + (uint32_t)lVar6;
          }
        }
        *cur_block_decoder = *cur_block_decoder + 1;
        lVar6 = 0;
      }
      sVar10 = *cur_block_decoder;
      uVar8 = (ulong)literal_split_decoder->positions_end[sVar10];
      if (uVar8 <= pos) {
        do {
          uVar8 = (ulong)literal_split_decoder->positions_end[sVar10 + 1];
          sVar10 = sVar10 + 1;
        } while (uVar8 <= pos);
        *cur_block_decoder = sVar10;
      }
      uVar1 = literal_split_decoder->positions_begin[sVar10];
      uVar9 = cmds[uVar7].insert_len_;
      uVar3 = pos + uVar9;
      if (pos < uVar1) {
        if (uVar3 <= uVar8) {
          lVar6 = (lVar6 - (ulong)uVar1) + uVar3;
          goto LAB_00116a1e;
        }
        lVar6 = lVar6 + (ulong)((int)uVar8 - uVar1);
        if (lVar6 != 0) {
          uVar7 = (ulong)literal_split_decoder->types[sVar10];
          if (*(int *)((long)__s + uVar7 * 4) == -1) {
            *(int *)((long)__s + uVar7 * 4) = (int)literal_split->num_types;
          }
          sVar10 = literal_split->num_blocks;
          uVar5 = (uint32_t)lVar6;
          if ((sVar10 == 0) ||
             (*(uint *)((long)__s + uVar7 * 4) != (uint)literal_split->types[sVar10 - 1])) {
            literal_split->types[sVar10] = *(uint8_t *)((long)__s + uVar7 * 4);
            sVar10 = literal_split->num_blocks;
            literal_split->lengths[sVar10] = uVar5;
            uVar1 = (uint)literal_split->num_types;
            bVar4 = literal_split->types[sVar10] + 1;
            uVar9 = (uint)bVar4;
            if (bVar4 < (byte)uVar1) {
              uVar9 = uVar1;
            }
            literal_split->num_types = (ulong)(uVar9 & 0xff);
            literal_split->num_blocks = sVar10 + 1;
          }
          else {
            literal_split->lengths[sVar10 - 1] = literal_split->lengths[sVar10 - 1] + uVar5;
          }
        }
LAB_00116ab2:
        *cur_block_decoder = *cur_block_decoder + 1;
        lVar6 = 0;
      }
      else {
        if (uVar8 < uVar3) {
          lVar6 = (uVar8 - pos) + lVar6;
          if (lVar6 != 0) {
            uVar7 = (ulong)literal_split_decoder->types[sVar10];
            if (*(int *)((long)__s + uVar7 * 4) == -1) {
              *(int *)((long)__s + uVar7 * 4) = (int)literal_split->num_types;
            }
            sVar10 = literal_split->num_blocks;
            uVar5 = (uint32_t)lVar6;
            if ((sVar10 == 0) ||
               (*(uint *)((long)__s + uVar7 * 4) != (uint)literal_split->types[sVar10 - 1])) {
              literal_split->types[sVar10] = *(uint8_t *)((long)__s + uVar7 * 4);
              sVar10 = literal_split->num_blocks;
              literal_split->lengths[sVar10] = uVar5;
              uVar1 = (uint)literal_split->num_types;
              bVar4 = literal_split->types[sVar10] + 1;
              uVar9 = (uint)bVar4;
              if (bVar4 < (byte)uVar1) {
                uVar9 = uVar1;
              }
              literal_split->num_types = (ulong)(uVar9 & 0xff);
              literal_split->num_blocks = sVar10 + 1;
            }
            else {
              literal_split->lengths[sVar10 - 1] = literal_split->lengths[sVar10 - 1] + uVar5;
            }
          }
          goto LAB_00116ab2;
        }
        lVar6 = lVar6 + (ulong)uVar9;
LAB_00116a1e:
        pos = pos + ((cmds[uVar7].copy_len_ & 0x1ffffff) + uVar9);
        iVar2 = iVar2 + 1;
      }
      uVar7 = (ulong)iVar2;
    } while (uVar7 < num_commands);
  }
  if (lVar6 != 0) {
    uVar7 = (ulong)literal_split_decoder->types[*cur_block_decoder];
    if (*(int *)((long)__s + uVar7 * 4) == -1) {
      *(int *)((long)__s + uVar7 * 4) = (int)literal_split->num_types;
    }
    sVar10 = literal_split->num_blocks;
    if ((sVar10 == 0) ||
       (*(uint *)((long)__s + uVar7 * 4) != (uint)literal_split->types[sVar10 - 1])) {
      literal_split->types[sVar10] = *(uint8_t *)((long)__s + uVar7 * 4);
      sVar10 = literal_split->num_blocks;
      literal_split->lengths[sVar10] = (uint32_t)lVar6;
      uVar1 = (uint)literal_split->num_types;
      bVar4 = literal_split->types[sVar10] + 1;
      uVar9 = (uint)bVar4;
      if (bVar4 < (byte)uVar1) {
        uVar9 = uVar1;
      }
      literal_split->num_types = (ulong)(uVar9 & 0xff);
      literal_split->num_blocks = sVar10 + 1;
    }
    else {
      literal_split->lengths[sVar10 - 1] = literal_split->lengths[sVar10 - 1] + (uint32_t)lVar6;
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockLiteralsFromStored(
                            MemoryManager* m,
                            const Command* cmds,
                            const size_t num_commands,
                            const size_t pos,
                            const size_t mask,
                            BlockSplit* literal_split,
                            const BlockSplitFromDecoder* literal_split_decoder,
                            size_t* cur_block_decoder) {
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, literal_split->types, literal_split->types_alloc_size,
      literal_split_decoder->num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, literal_split->lengths, literal_split->lengths_alloc_size,
      literal_split_decoder->num_blocks);
  size_t cur_pos = pos;
  literal_split->num_blocks = 0;
  literal_split->num_types = 0;
  size_t cur_length = 0;
  /* Mapping of the types from decoder (they increase with each metablock)
     to the appropriate types */
  int* types_mapping = (int*)malloc(sizeof(int) *
                                            literal_split_decoder->num_types);
  for (int i = 0; i < literal_split_decoder->num_types; ++i) {
    types_mapping[i] = -1;
  }

  int i = 0;
  while (i < num_commands) {
    /* Considering an interval of literals for current command:
       from cur_pos to cur_pos + insert_len*/

    /* If current literals interval lies after the current block
      that means we've finished the current block.
      If some literals have fallen inside current block before
      then need to save it*/
    if (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      if (cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                      literal_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (literal_split->num_blocks > 0 &&
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
              literal_split->types[literal_split->num_blocks - 1]) {
          literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          literal_split->types[literal_split->num_blocks] =
              types_mapping[literal_split_decoder->types[*cur_block_decoder]];
          literal_split->lengths[literal_split->num_blocks] = cur_length;
          literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                            literal_split->types[literal_split->num_blocks] + 1);
          literal_split->num_blocks++;
        }
        cur_length = 0;
      }
      (*cur_block_decoder)++;

    }
    /* Go through decoder blocks until a block with cur_pos inside is found */
    while (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      (*cur_block_decoder)++;
    }
    /* Means that the first part of literals interval is already saved
       as a part of the previous block,
       now only need to look at the second part */
    if (cur_pos < literal_split_decoder->positions_begin[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                  literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cur_pos + cmds[i].insert_len_ -
                  literal_split_decoder->positions_begin[*cur_block_decoder];
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder] -
                      literal_split_decoder->positions_begin[*cur_block_decoder];
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
    /* If literals interval starts inside the current block
       then look where it ends*/
    else if (cur_pos < literal_split_decoder->positions_end[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cmds[i].insert_len_;
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder]
                                                                      - cur_pos;
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                    types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
  }
  /* Save the last in metablock block */
  if (cur_length > 0) {
    if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
      types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
    }
    /* If the same block type as for a previous block then merge them */
    if (literal_split->num_blocks > 0 &&
        types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
          literal_split->types[literal_split->num_blocks - 1]) {
      literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
    } else {
      literal_split->types[literal_split->num_blocks] =
                  types_mapping[literal_split_decoder->types[*cur_block_decoder]];
      literal_split->lengths[literal_split->num_blocks] = cur_length;
      literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
      literal_split->num_blocks++;
    }
  }
}